

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vad_filterbank.c
# Opt level: O0

void HighPassFilter(int16_t *data_in,size_t data_length,int16_t *filter_state,int16_t *data_out)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  int16_t *piStack_40;
  int32_t tmp32;
  int16_t *out_ptr;
  int16_t *in_ptr;
  size_t i;
  int16_t *data_out_local;
  int16_t *filter_state_local;
  size_t data_length_local;
  int16_t *data_in_local;
  
  piStack_40 = data_out;
  out_ptr = data_in;
  for (in_ptr = (int16_t *)0x0; in_ptr < data_length; in_ptr = (int16_t *)((long)in_ptr + 1)) {
    sVar1 = *out_ptr;
    sVar2 = *filter_state;
    sVar3 = filter_state[1];
    filter_state[1] = *filter_state;
    *filter_state = *out_ptr;
    sVar4 = filter_state[3];
    filter_state[3] = filter_state[2];
    filter_state[2] =
         (int16_t)(sVar3 * 0x19e7 + sVar2 * -0x33ce + sVar1 * 0x19e7 + filter_state[2] * 0x1e4c +
                   sVar4 * -0x15f4 >> 0xe);
    *piStack_40 = filter_state[2];
    piStack_40 = piStack_40 + 1;
    out_ptr = out_ptr + 1;
  }
  return;
}

Assistant:

static void HighPassFilter(const int16_t* data_in, size_t data_length,
                           int16_t* filter_state, int16_t* data_out) {
  size_t i;
  const int16_t* in_ptr = data_in;
  int16_t* out_ptr = data_out;
  int32_t tmp32 = 0;


  // The sum of the absolute values of the impulse response:
  // The zero/pole-filter has a max amplification of a single sample of: 1.4546
  // Impulse response: 0.4047 -0.6179 -0.0266  0.1993  0.1035  -0.0194
  // The all-zero section has a max amplification of a single sample of: 1.6189
  // Impulse response: 0.4047 -0.8094  0.4047  0       0        0
  // The all-pole section has a max amplification of a single sample of: 1.9931
  // Impulse response: 1.0000  0.4734 -0.1189 -0.2187 -0.0627   0.04532

  for (i = 0; i < data_length; i++) {
    // All-zero section (filter coefficients in Q14).
    tmp32 = kHpZeroCoefs[0] * *in_ptr;
    tmp32 += kHpZeroCoefs[1] * filter_state[0];
    tmp32 += kHpZeroCoefs[2] * filter_state[1];
    filter_state[1] = filter_state[0];
    filter_state[0] = *in_ptr++;

    // All-pole section (filter coefficients in Q14).
    tmp32 -= kHpPoleCoefs[1] * filter_state[2];
    tmp32 -= kHpPoleCoefs[2] * filter_state[3];
    filter_state[3] = filter_state[2];
    filter_state[2] = (int16_t) (tmp32 >> 14);
    *out_ptr++ = filter_state[2];
  }
}